

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_VectorDefaultedFixedString_Test::~TApp_VectorDefaultedFixedString_Test
          (TApp_VectorDefaultedFixedString_Test *this)

{
  TApp_VectorDefaultedFixedString_Test *this_local;
  
  ~TApp_VectorDefaultedFixedString_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, VectorDefaultedFixedString) {
    std::vector<std::string> strvec{"one"};
    std::vector<std::string> answer{"mystring", "mystring2", "mystring3"};

    CLI::Option *opt = app.add_option("-s,--string", strvec, "", true)->expected(3);
    EXPECT_EQ(3, opt->get_expected());

    args = {"--string", "mystring", "mystring2", "mystring3"};
    run();
    EXPECT_EQ((size_t)3, app.count("--string"));
    EXPECT_EQ(answer, strvec);
}